

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ProgressBar::ProgressBar(ProgressBar *this,QWidget *parent)

{
  QVariantAnimation *pQVar1;
  ProgressBarPrivate *this_00;
  undefined4 *puVar2;
  QObject local_40 [8];
  code *local_38;
  ImplFn local_30;
  code *local_28;
  undefined8 local_20;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00193ff8;
  *(undefined ***)&this->field_0x10 = &PTR__ProgressBar_001941a8;
  this_00 = (ProgressBarPrivate *)operator_new(0x68);
  this_00->q = this;
  this_00->minimum = 0;
  this_00->maximum = 0;
  this_00->value = -1;
  this_00->lastPaintedValue = -1;
  this_00->orientation = Horizontal;
  this_00->invertedAppearance = false;
  this_00->grooveHeight = 3;
  (this_00->highlightColor).cspec = Invalid;
  (this_00->highlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->highlightColor).ct + 2) = 0;
  (this_00->grooveColor).cspec = Invalid;
  (this_00->grooveColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->grooveColor).ct + 2) = 0;
  (this_00->animationColor).cspec = Invalid;
  (this_00->animationColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->animationColor).ct + 2) = 0;
  this_00->animation = (QVariantAnimation *)0x0;
  this_00->animate = true;
  (this->d).d = this_00;
  ProgressBarPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  pQVar1 = ((this->d).d)->animation;
  local_28 = QVariantAnimation::valueChanged;
  local_20 = 0;
  local_38 = _q_animation;
  local_30 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::ProgressBar::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = _q_animation;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_28,(void **)this,
             (QSlotObjectBase *)&local_38,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

ProgressBar::ProgressBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ProgressBarPrivate( this ) )
{
	d->init();

	connect( d->animation, &QVariantAnimation::valueChanged,
		this, &ProgressBar::_q_animation );
}